

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

VerifySignTxInUtxoData * __thiscall
cfd::js::api::json::VerifySignTxInUtxoData::GetConfidentialValueCommitmentString_abi_cxx11_
          (VerifySignTxInUtxoData *this,VerifySignTxInUtxoData *obj)

{
  VerifySignTxInUtxoData *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->confidential_value_commitment_);
  return this;
}

Assistant:

static std::string GetConfidentialValueCommitmentString(  // line separate
      const VerifySignTxInUtxoData& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.confidential_value_commitment_);
  }